

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriQuery.c
# Opt level: O1

wchar_t uriComposeQueryW(wchar_t *dest,UriQueryListW *queryList,wchar_t maxChars,
                        wchar_t *charsWritten)

{
  wchar_t wVar1;
  
  wVar1 = L'\x02';
  if (queryList != (UriQueryListW *)0x0 && dest != (wchar_t *)0x0) {
    if (maxChars < L'\x01') {
      return L'\x04';
    }
    wVar1 = uriComposeQueryEngineW(dest,queryList,maxChars,charsWritten,(wchar_t *)0x0,1,1);
  }
  return wVar1;
}

Assistant:

int URI_FUNC(ComposeQueryEx)(URI_CHAR * dest,
		const URI_TYPE(QueryList) * queryList, int maxChars, int * charsWritten,
		UriBool spaceToPlus, UriBool normalizeBreaks) {
	if ((dest == NULL) || (queryList == NULL)) {
		return URI_ERROR_NULL;
	}

	if (maxChars < 1) {
		return URI_ERROR_OUTPUT_TOO_LARGE;
	}

	return URI_FUNC(ComposeQueryEngine)(dest, queryList, maxChars,
			charsWritten, NULL, spaceToPlus, normalizeBreaks);
}